

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_mon_spell_name(parser *p)

{
  errr eVar1;
  parser_error pVar2;
  void *pvVar3;
  char *what;
  undefined8 *v;
  wchar_t index;
  
  pvVar3 = parser_priv(p);
  what = parser_getstr(p,"name");
  eVar1 = grab_name("monster spell",what,r_info_spell_flags,0x62,&index);
  if (eVar1 == 0) {
    v = (undefined8 *)mem_zalloc(0x28);
    *v = pvVar3;
    *(undefined2 *)(v + 1) = (undefined2)index;
    pvVar3 = mem_zalloc(0x40);
    v[4] = pvVar3;
    parser_setpriv(p,v);
    pVar2 = PARSE_ERROR_NONE;
  }
  else {
    pVar2 = PARSE_ERROR_INVALID_SPELL_NAME;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_mon_spell_name(struct parser *p) {
	struct monster_spell *h = parser_priv(p);
	const char *name = parser_getstr(p, "name");
	struct monster_spell *s;
	int index;

	if (grab_name("monster spell", name, r_info_spell_flags,
			N_ELEMENTS(r_info_spell_flags) - 1, &index)) {
		return PARSE_ERROR_INVALID_SPELL_NAME;
	}
	s = mem_zalloc(sizeof(*s));
	s->next = h;
	s->index = index;
	s->level = mem_zalloc(sizeof(*(s->level)));
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}